

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeRecordUnpack(KeyInfo *pKeyInfo,int nKey,void *pKey,UnpackedRecord *p)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  u32 uVar4;
  uint uVar5;
  uint uVar6;
  Mem *pMem;
  u16 uVar7;
  u32 serial_type;
  u32 szHdr;
  u32 local_48;
  uint local_44;
  int local_40;
  uint local_3c;
  UnpackedRecord *local_38;
  
  pMem = p->aMem;
  p->default_rc = '\0';
  local_40 = nKey;
  local_38 = p;
  if (*pKey < '\0') {
    bVar2 = sqlite3GetVarint32((uchar *)pKey,&local_44);
    uVar6 = (uint)bVar2;
  }
  else {
    uVar6 = 1;
    local_44 = (int)*pKey;
  }
  uVar7 = 0;
  local_3c = local_44;
  uVar5 = local_44;
  do {
    if ((local_3c <= uVar6) || (local_40 < (int)uVar5)) break;
    cVar1 = *(char *)((long)pKey + (ulong)uVar6);
    if (cVar1 < '\0') {
      bVar2 = sqlite3GetVarint32((uchar *)((ulong)uVar6 + (long)pKey),&local_48);
      uVar3 = (uint)bVar2;
    }
    else {
      uVar3 = 1;
      local_48 = (int)cVar1;
    }
    uVar6 = uVar6 + uVar3;
    pMem->enc = pKeyInfo->enc;
    pMem->db = pKeyInfo->db;
    pMem->szMalloc = 0;
    pMem->z = (char *)0x0;
    uVar4 = sqlite3VdbeSerialGet((uchar *)((long)(int)uVar5 + (long)pKey),local_48,pMem);
    uVar5 = uVar5 + uVar4;
    pMem = pMem + 1;
    uVar7 = uVar7 + 1;
  } while (uVar7 < local_38->nField);
  local_38->nField = uVar7;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeRecordUnpack(
  KeyInfo *pKeyInfo,     /* Information about the record format */
  int nKey,              /* Size of the binary record */
  const void *pKey,      /* The binary record */
  UnpackedRecord *p      /* Populate this structure before returning. */
){
  const unsigned char *aKey = (const unsigned char *)pKey;
  int d; 
  u32 idx;                        /* Offset in aKey[] to read from */
  u16 u;                          /* Unsigned loop counter */
  u32 szHdr;
  Mem *pMem = p->aMem;

  p->default_rc = 0;
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  idx = getVarint32(aKey, szHdr);
  d = szHdr;
  u = 0;
  while( idx<szHdr && d<=nKey ){
    u32 serial_type;

    idx += getVarint32(&aKey[idx], serial_type);
    pMem->enc = pKeyInfo->enc;
    pMem->db = pKeyInfo->db;
    /* pMem->flags = 0; // sqlite3VdbeSerialGet() will set this for us */
    pMem->szMalloc = 0;
    pMem->z = 0;
    d += sqlite3VdbeSerialGet(&aKey[d], serial_type, pMem);
    pMem++;
    if( (++u)>=p->nField ) break;
  }
  assert( u<=pKeyInfo->nField + 1 );
  p->nField = u;
}